

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_context.cpp
# Opt level: O0

void __thiscall duckdb::TransactionContext::ClearTransaction(TransactionContext *this)

{
  unique_ptr<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>,_true> *in_RDI;
  TransactionContext *in_stack_fffffffffffffff0;
  
  SetAutoCommit(in_stack_fffffffffffffff0,SUB81((ulong)in_RDI >> 0x38,0));
  unique_ptr<duckdb::MetaTransaction,std::default_delete<duckdb::MetaTransaction>,true>::
  unique_ptr<std::default_delete<duckdb::MetaTransaction>,void>
            ((unique_ptr<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>,_true>
              *)in_stack_fffffffffffffff0,in_RDI);
  unique_ptr<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>,_true>::operator=
            ((unique_ptr<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>,_true>
              *)in_stack_fffffffffffffff0,in_RDI);
  unique_ptr<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>,_true>::
  ~unique_ptr((unique_ptr<duckdb::MetaTransaction,_std::default_delete<duckdb::MetaTransaction>,_true>
               *)0xcc1196);
  return;
}

Assistant:

void TransactionContext::ClearTransaction() {
	SetAutoCommit(true);
	current_transaction = nullptr;
}